

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O0

long sd_supp(int child,long skip_count)

{
  undefined8 in_RSI;
  long in_stack_ffffffffffffffe8;
  int nStream;
  
  nStream = (int)((ulong)in_RSI >> 0x20);
  advanceStream(nStream,in_stack_ffffffffffffffe8,0);
  advanceStream(nStream,in_stack_ffffffffffffffe8,0);
  advanceStream(nStream,in_stack_ffffffffffffffe8,0);
  advanceStream(nStream,in_stack_ffffffffffffffe8,0);
  advanceStream(nStream,in_stack_ffffffffffffffe8,0);
  advanceStream(nStream,in_stack_ffffffffffffffe8,0);
  advanceStream(nStream,in_stack_ffffffffffffffe8,0);
  advanceStream(nStream,in_stack_ffffffffffffffe8,0);
  advanceStream(nStream,in_stack_ffffffffffffffe8,0);
  return 0;
}

Assistant:

long
sd_supp(int child, DSS_HUGE skip_count)
{
   UNUSED(child);
   ADVANCE_STREAM(S_NTRG_SD, skip_count);
   ADVANCE_STREAM(S_PHNE_SD, 3L * skip_count);
   ADVANCE_STREAM(S_ABAL_SD, skip_count);
   ADVANCE_STREAM(S_ADDR_SD, skip_count * 9);
   ADVANCE_STREAM(S_CMNT_SD, skip_count * 2);
   ADVANCE_STREAM(BBB_CMNT_SD, skip_count);
   ADVANCE_STREAM(BBB_JNK_SD, skip_count);
   ADVANCE_STREAM(BBB_OFFSET_SD, skip_count);
   ADVANCE_STREAM(BBB_TYPE_SD, skip_count);      /* avoid one trudge */
   
   return(0L);
}